

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int connect_to_pulseaudio(void)

{
  int local_1c;
  long lStack_18;
  int process_ret;
  pa_mainloop_api *mainloop_api;
  int ret;
  
  mainloop = (pa_mainloop *)pa_mainloop_new();
  lStack_18 = pa_mainloop_get_api(mainloop);
  if (lStack_18 != 0) {
    pa = (pa_context *)pa_context_new(lStack_18,0);
    if (pa == (pa_context *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Could not create PulseAudio context.\n");
      mainloop_api._4_4_ = 1;
    }
    else {
      pa_context_set_state_callback(pa,context_state_callback,0);
      mainloop_api._0_4_ = pa_context_connect(pa,0,0);
      if ((int)mainloop_api < 0) {
        std::operator<<((ostream *)&std::cerr,"Failed to connect.\n");
        mainloop_api._4_4_ = 2;
      }
      else {
        signal(2,interrupt_loop);
        pa_mainloop_run(mainloop,&local_1c);
        mainloop_api._4_4_ = local_1c;
      }
    }
    return mainloop_api._4_4_;
  }
  __assert_fail("mainloop_api",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/main.cpp"
                ,0x3c,"int connect_to_pulseaudio()");
}

Assistant:

int connect_to_pulseaudio() {
    int ret;

    // Use the "simple" mainloop API
    mainloop = pa_mainloop_new();
    pa_mainloop_api* mainloop_api = pa_mainloop_get_api(mainloop);
    assert(mainloop_api);

    // Create a PA context
    pa = pa_context_new(mainloop_api, NULL);
    if (pa == NULL) {
        cerr << "Could not create PulseAudio context.\n";
        return 1;
    }

    // Set the state callback to be notified when the connection succeeds.
    pa_context_set_state_callback(pa, context_state_callback, NULL);

    ret = pa_context_connect(pa, NULL, PA_CONTEXT_NOFLAGS, NULL);
    if (ret < 0) {
        cerr << "Failed to connect.\n";
        return QUIT_RETRY_CONNECT;
    }

    signal(SIGINT, interrupt_loop);

    // The mainloop can return a value, just like UNIX processes
    int process_ret;
    pa_mainloop_run(mainloop, &process_ret);

    return process_ret;
}